

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

int __thiscall deqp::egl::Image::ImageFormatCase::init(ImageFormatCase *this,EVP_PKEY_CTX *ctx)

{
  EglTestContext *this_00;
  Visibility visibility_;
  int iVar1;
  int extraout_EAX;
  Library *egl_00;
  NativeDisplayFactory *factory;
  CommandLine *pCVar2;
  NativeWindowFactory *pNVar3;
  NativeDisplay *pNVar4;
  EGLDisplay pvVar5;
  EGLConfig pvVar6;
  undefined4 extraout_var;
  EGLSurface pvVar7;
  size_type sVar8;
  const_reference pvVar9;
  GLES2ImageApi *this_01;
  TestLog *log;
  GLES2ImageApi *local_50;
  ImageApi *api;
  int contextNdx;
  char *extensions [1];
  NativeWindowFactory *windowFactory;
  Library *egl;
  ImageFormatCase *this_local;
  
  egl_00 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  factory = EglTestContext::getNativeDisplayFactory((this->super_TestCase).m_eglTestCtx);
  pCVar2 = tcu::TestContext::getCommandLine
                     ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pNVar3 = eglu::selectNativeWindowFactory(factory,pCVar2);
  pNVar4 = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  pvVar5 = eglu::getAndInitDisplay(pNVar4,(Version *)0x0);
  this->m_display = pvVar5;
  pvVar6 = getConfig(this);
  this->m_config = pvVar6;
  pNVar4 = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  pvVar5 = this->m_display;
  pvVar6 = this->m_config;
  pCVar2 = tcu::TestContext::getCommandLine
                     ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  visibility_ = eglu::parseWindowVisibility(pCVar2);
  eglu::WindowParams::WindowParams((WindowParams *)extensions,0x1e0,0x1e0,visibility_);
  iVar1 = (*(pNVar3->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                    (pNVar3,pNVar4,pvVar5,pvVar6,0,extensions);
  this->m_window = (NativeWindow *)CONCAT44(extraout_var,iVar1);
  pNVar4 = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  pvVar7 = eglu::createWindowSurface
                     (pNVar4,this->m_window,this->m_display,this->m_config,(EGLAttrib *)0x0);
  this->m_surface = pvVar7;
  _contextNdx = "GL_OES_EGL_image";
  this_00 = (this->super_TestCase).m_eglTestCtx;
  api._4_4_ = glu::ApiType::es(2,0);
  EglTestContext::initGLFunctions(this_00,&this->m_gl,api._4_4_,1,(char **)&contextNdx);
  for (api._0_4_ = 0; iVar1 = (int)api,
      sVar8 = std::
              vector<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
              ::size(&(this->m_spec).contexts), iVar1 < (int)sVar8; api._0_4_ = (int)api + 1) {
    local_50 = (GLES2ImageApi *)0x0;
    pvVar9 = std::
             vector<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
             ::operator[](&(this->m_spec).contexts,(long)(int)api);
    if (*pvVar9 == API_GLES2) {
      this_01 = (GLES2ImageApi *)operator_new(0x50);
      iVar1 = (int)api;
      log = glu::CallLogWrapper::getLog(&this->super_CallLogWrapper);
      GLES2ImageApi::GLES2ImageApi
                (this_01,egl_00,&this->m_gl,iVar1,log,this->m_display,this->m_surface,this->m_config
                );
      local_50 = this_01;
    }
    std::vector<deqp::egl::Image::ImageApi_*,_std::allocator<deqp::egl::Image::ImageApi_*>_>::
    push_back(&this->m_apiContexts,(value_type *)&local_50);
  }
  checkExtensions(this);
  return extraout_EAX;
}

Assistant:

void ImageFormatCase::init (void)
{
	const Library&						egl				= m_eglTestCtx.getLibrary();
	const eglu::NativeWindowFactory&	windowFactory	= eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

	try
	{
		m_display	= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
		m_config	= getConfig();
		m_window	= windowFactory.createWindow(&m_eglTestCtx.getNativeDisplay(), m_display, m_config, DE_NULL, eglu::WindowParams(480, 480, eglu::parseWindowVisibility(m_testCtx.getCommandLine())));
		m_surface	= eglu::createWindowSurface(m_eglTestCtx.getNativeDisplay(), *m_window, m_display, m_config, DE_NULL);

		{
			const char* extensions[] = { "GL_OES_EGL_image" };
			m_eglTestCtx.initGLFunctions(&m_gl, glu::ApiType::es(2, 0), DE_LENGTH_OF_ARRAY(extensions), &extensions[0]);
		}

		for (int contextNdx = 0; contextNdx < (int)m_spec.contexts.size(); contextNdx++)
		{
			ImageApi* api = DE_NULL;
			switch (m_spec.contexts[contextNdx])
			{
				case TestSpec::API_GLES2:
				{
					api = new GLES2ImageApi(egl, m_gl, contextNdx, getLog(), m_display, m_surface, m_config);
					break;
				}

				default:
					DE_ASSERT(false);
					break;
			}
			m_apiContexts.push_back(api);
		}
		checkExtensions();
	}
	catch (...)
	{
		deinit();
		throw;
	}
}